

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
::WriteCon2JSON(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                *this,MemoryWriter *wrt,int i_con,Container *cnt)

{
  int iVar1;
  char *pcVar2;
  Container *in_RCX;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RSI;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  char **in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_stack_fffffffffffffee0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff08;
  string_view in_stack_ffffffffffffff10;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_stack_ffffffffffffff38;
  JSONW *in_stack_ffffffffffffff40;
  BasicConstraintKeeper *in_stack_ffffffffffffff80;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_30;
  Container *local_20;
  
  local_20 = in_RCX;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::MiniJSONWriter
            (&local_30,in_RSI);
  BasicConstraintKeeper::GetShortTypeName(in_stack_ffffffffffffff80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1bc7a5);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (int *)in_stack_fffffffffffffec8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1bc804);
  Container::GetCon((Container *)0x1bc811);
  pcVar2 = BasicConstraint::name((BasicConstraint *)0x1bc822);
  if (*pcVar2 != '\0') {
    in_stack_fffffffffffffee0 = Container::GetCon((Container *)0x1bc844);
    in_stack_fffffffffffffed8 = BasicConstraint::name((BasicConstraint *)0x1bc855);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1bc8c8);
  }
  iVar1 = Container::GetDepth(local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffed0),(int *)in_stack_fffffffffffffec8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1bc9c3);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  Container::GetCon((Container *)0x1bc9ff);
  WriteJSON<mp::QuadAndLinTerms,mp::AlgConRhs<0>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1bca1f);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1bca2c);
  return;
}

Assistant:

void WriteCon2JSON(
      fmt::MemoryWriter& wrt, int i_con, const Container& cnt) {
    MiniJSONWriter jw(wrt);
    jw["CON_TYPE"] = GetShortTypeName();
    jw["index"] = i_con;
    if (*cnt.GetCon().name())
      jw["name"] = cnt.GetCon().name();
    jw["depth"] = cnt.GetDepth();
    WriteJSON(jw["data"], cnt.GetCon());
  }